

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv_csp.c
# Opt level: O0

SharpYuvConversionMatrix * SharpYuvGetConversionMatrix(SharpYuvMatrixType matrix_type)

{
  SharpYuvMatrixType matrix_type_local;
  SharpYuvConversionMatrix *local_8;
  
  switch(matrix_type) {
  case kSharpYuvMatrixWebp:
    local_8 = &kWebpMatrix;
    break;
  case kSharpYuvMatrixRec601Limited:
    local_8 = &kRec601LimitedMatrix;
    break;
  case kSharpYuvMatrixRec601Full:
    local_8 = &kRec601FullMatrix;
    break;
  case kSharpYuvMatrixRec709Limited:
    local_8 = &kRec709LimitedMatrix;
    break;
  case kSharpYuvMatrixRec709Full:
    local_8 = &kRec709FullMatrix;
    break;
  case kSharpYuvMatrixNum:
    local_8 = (SharpYuvConversionMatrix *)0x0;
    break;
  default:
    local_8 = (SharpYuvConversionMatrix *)0x0;
  }
  return local_8;
}

Assistant:

const SharpYuvConversionMatrix* SharpYuvGetConversionMatrix(
    SharpYuvMatrixType matrix_type) {
  switch (matrix_type) {
    case kSharpYuvMatrixWebp:
      return &kWebpMatrix;
    case kSharpYuvMatrixRec601Limited:
      return &kRec601LimitedMatrix;
    case kSharpYuvMatrixRec601Full:
      return &kRec601FullMatrix;
    case kSharpYuvMatrixRec709Limited:
      return &kRec709LimitedMatrix;
    case kSharpYuvMatrixRec709Full:
      return &kRec709FullMatrix;
    case kSharpYuvMatrixNum:
      return NULL;
  }
  return NULL;
}